

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_tIME(png_structrp png_ptr,png_const_timep mod_time)

{
  png_byte local_1f [2];
  png_byte local_1d;
  png_byte local_1c;
  png_byte local_1b;
  png_byte local_1a;
  png_byte local_19;
  png_const_timep ppStack_18;
  png_byte buf [7];
  png_const_timep mod_time_local;
  png_structrp png_ptr_local;
  
  ppStack_18 = mod_time;
  if ((((mod_time->month < 0xd) && (mod_time->month != '\0')) && (mod_time->day < 0x20)) &&
     (((mod_time->day != '\0' && (mod_time->hour < 0x18)) && (mod_time->second < 0x3d)))) {
    png_save_uint_16(local_1f,(uint)mod_time->year);
    local_1d = ppStack_18->month;
    local_1c = ppStack_18->day;
    local_1b = ppStack_18->hour;
    local_1a = ppStack_18->minute;
    local_19 = ppStack_18->second;
    png_write_complete_chunk(png_ptr,0x74494d45,local_1f,7);
  }
  else {
    png_warning(png_ptr,"Invalid time specified for tIME chunk");
  }
  return;
}

Assistant:

void /* PRIVATE */
png_write_tIME(png_structrp png_ptr, png_const_timep mod_time)
{
   png_byte buf[7];

   png_debug(1, "in png_write_tIME");

   if (mod_time->month  > 12 || mod_time->month  < 1 ||
       mod_time->day    > 31 || mod_time->day    < 1 ||
       mod_time->hour   > 23 || mod_time->second > 60)
   {
      png_warning(png_ptr, "Invalid time specified for tIME chunk");
      return;
   }

   png_save_uint_16(buf, mod_time->year);
   buf[2] = mod_time->month;
   buf[3] = mod_time->day;
   buf[4] = mod_time->hour;
   buf[5] = mod_time->minute;
   buf[6] = mod_time->second;

   png_write_complete_chunk(png_ptr, png_tIME, buf, (png_size_t)7);
}